

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_ws_recv_handler(ws_session_t *session)

{
  byte bVar1;
  _func_void_ws_context_t_ptr_ws_session_t_ptr *p_Var2;
  _func_void_ws_session_t_ptr *p_Var3;
  int iVar4;
  ws_context_t *ctx;
  undefined1 auStack_38 [8];
  nh_stream_t stream;
  
  if ((session->flags & 2) == 0) {
    auStack_38 = (undefined1  [8])0x0;
    stream.buf = (char *)0x0;
    stream.capacity = 0;
    stream.length = 0;
    iVar4 = nh_read_socket((nh_stream_t *)auStack_38,session->socket);
    if (iVar4 == 0) {
      p_Var3 = session->ws_handlers->on_closed;
      if (p_Var3 != (_func_void_ws_session_t_ptr *)0x0) {
        (*p_Var3)(session);
      }
      nh_ws_session_free(session);
    }
    else {
      ctx = session->incomplete_recv;
      if ((ctx == (ws_context_t *)0x0) || (ctx->parse_state == PARSE_WS_DONE)) {
        ctx = (ws_context_t *)calloc(1,0x48);
        (ctx->stream).buf = (char *)auStack_38;
        *(char **)&(ctx->stream).capacity = stream.buf;
        (ctx->frame).payload = (char *)0x0;
        (ctx->frame).payload_consumed_length = 0;
        (ctx->frame).payload_length = 0;
        (ctx->frame).masking_key[0] = '\0';
        (ctx->frame).masking_key[1] = '\0';
        (ctx->frame).masking_key[2] = '\0';
        (ctx->frame).masking_key[3] = '\0';
        *(undefined4 *)&(ctx->frame).field_0x14 = 0;
        (ctx->stream).index = stream.capacity;
        *(uint32_t *)&(ctx->stream).field_0x14 = stream.length;
        (ctx->frame).fin = '\0';
        (ctx->frame).opcode = '\0';
        (ctx->frame).mask = '\0';
        *(undefined5 *)&(ctx->frame).field_0x3 = 0;
      }
      else {
        nh_stream_copy(&ctx->stream,(char *)auStack_38,stream.buf._4_4_);
      }
      nh_ws_parse(ctx);
      if (ctx->parse_state == PARSE_WS_DONE) {
        session->incomplete_recv = (ws_context_t *)0x0;
        bVar1 = (ctx->frame).opcode;
        if (bVar1 - 1 < 2) {
          p_Var2 = session->ws_handlers->on_message;
          if (p_Var2 != (_func_void_ws_context_t_ptr_ws_session_t_ptr *)0x0) {
            (*p_Var2)(ctx,session);
          }
        }
        else {
          if (bVar1 == 8) {
            p_Var3 = session->ws_handlers->on_close;
            if (p_Var3 != (_func_void_ws_session_t_ptr *)0x0) {
              (*p_Var3)(session);
            }
            nh_ws_on_close_handler(ctx,session);
            return;
          }
          if (bVar1 == 9) {
            nh_ws_on_ping_handler(ctx,session);
          }
        }
        session->timeout = 0x78;
      }
      else {
        session->incomplete_recv = ctx;
      }
    }
  }
  return;
}

Assistant:

void nh_ws_recv_handler(ws_session_t *session) {
    // check is closed
    if (FLAG_CHECK(session->flags, WEBSOCKET_SESSION_CLOSE)) return;

    nh_stream_t stream = {0};
    if (nh_read_socket(&stream, session->socket) == 0) {
        CALL_SESSION_CALLBACK(session->ws_handlers->on_closed, session);
        nh_ws_session_free(session);
        return;
    }
    ws_context_t *ctx;
    if (session->incomplete_recv != NULL && session->incomplete_recv->parse_state != PARSE_WS_DONE) {
        ctx = session->incomplete_recv;
        nh_stream_copy(&ctx->stream, stream.buf, stream.length);
    } else {
        ctx = calloc(1, sizeof(ws_context_t));
        *ctx = (ws_context_t) {
            .stream = stream,
        };
    }
    // parse
    nh_ws_parse(ctx);
    if (ctx->parse_state != PARSE_WS_DONE) {
        session->incomplete_recv = ctx;
        return;
    }
    session->incomplete_recv = NULL;
    // handle
    // DO NOT SUPPORT FIN == 0 && OPCODE == %x0
    switch (ctx->frame.opcode) {
        case WEBSOCKET_OP_TEXT:
        case WEBSOCKET_OP_BIN:
            CALL_CONTEXT_CALLBACK(session->ws_handlers->on_message, ctx, session);
            break;
        case WEBSOCKET_OP_CLOSE:
            // on_close callback
            CALL_SESSION_CALLBACK(session->ws_handlers->on_close, session);
            nh_ws_on_close_handler(ctx, session);
            return;
        case WEBSOCKET_OP_PING:
            nh_ws_on_ping_handler(ctx, session);
        case WEBSOCKET_OP_PONG:
        case WEBSOCKET_OP_CONTINUE:
        default:
            break;
    }
    session->timeout = WEBSOCKET_TIMEOUT;
}